

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint
          (TGlslangToSpvTraverser *this,TType *type,Id nominalTypeId,Id loadedId)

{
  Builder *this_00;
  Op OVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  int iVar5;
  Id loadedId_00;
  Id unaff_EBX;
  Id elementConvertedValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  TType glslangElementType;
  Id local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  TType local_c8;
  
  this_00 = &this->builder;
  OVar1 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[nominalTypeId]->opCode;
  if (OVar1 - OpTypeBool < 3) {
    IVar2 = spv::Builder::makeBoolType(this_00);
    if (IVar2 != nominalTypeId) {
      IVar3 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this_00,IVar3,0,false);
      IVar2 = spv::Builder::createBinOp(this_00,OpINotEqual,IVar2,loadedId,IVar3);
      return IVar2;
    }
  }
  else if (OVar1 == OpTypeArray) {
    IVar2 = convertGlslangToSpvType(this,type,SUB41(nominalTypeId,0));
    if (IVar2 != nominalTypeId) {
      if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
        uVar4 = 0;
        glslang::TType::TType(&local_c8,type,0,false);
        IVar3 = spv::Builder::getContainedTypeId(this_00,nominalTypeId);
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        iVar5 = (*type->_vptr_TType[0xf])(type);
        if (0 < iVar5) {
          do {
            loadedId_00 = spv::Builder::createCompositeExtract(this_00,loadedId,IVar3,uVar4);
            local_ec = convertLoadedBoolInUniformToUint(this,&local_c8,IVar3,loadedId_00);
            if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_e8,
                         (iterator)
                         local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_ec);
            }
            else {
              *local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_ec;
              local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar4 = uVar4 + 1;
            iVar5 = (*type->_vptr_TType[0xf])(type);
          } while ((int)uVar4 < iVar5);
        }
        unaff_EBX = spv::Builder::createCompositeConstruct(this_00,IVar2,&local_e8);
        if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        unaff_EBX = spv::Builder::createUnaryOp(this_00,OpCopyLogical,IVar2,loadedId);
      }
    }
    if (IVar2 != nominalTypeId) {
      return unaff_EBX;
    }
  }
  else if (OVar1 == OpTypeVector) {
    uVar4 = spv::Builder::getNumTypeConstituents(this_00,nominalTypeId);
    IVar2 = spv::Builder::makeBoolType(this_00);
    IVar2 = spv::Builder::makeVectorType(this_00,IVar2,uVar4);
    if (IVar2 != nominalTypeId) {
      IVar3 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this_00,IVar3,0,false);
      IVar3 = makeSmearedConstant(this,IVar3,uVar4);
      loadedId = spv::Builder::createBinOp(this_00,OpINotEqual,IVar2,loadedId,IVar3);
    }
  }
  return loadedId;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint(const glslang::TType& type,
                                                                 spv::Id nominalTypeId,
                                                                 spv::Id loadedId)
{
    if (builder.isScalarType(nominalTypeId)) {
        // Conversion for bool
        spv::Id boolType = builder.makeBoolType();
        if (nominalTypeId != boolType)
            return builder.createBinOp(spv::OpINotEqual, boolType, loadedId, builder.makeUintConstant(0));
    } else if (builder.isVectorType(nominalTypeId)) {
        // Conversion for bvec
        int vecSize = builder.getNumTypeComponents(nominalTypeId);
        spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
        if (nominalTypeId != bvecType)
            loadedId = builder.createBinOp(spv::OpINotEqual, bvecType, loadedId,
                makeSmearedConstant(builder.makeUintConstant(0), vecSize));
    } else if (builder.isArrayType(nominalTypeId)) {
        // Conversion for bool array
        spv::Id boolArrayTypeId = convertGlslangToSpvType(type);
        if (nominalTypeId != boolArrayTypeId)
        {
            // Use OpCopyLogical from SPIR-V 1.4 if available.
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4)
                return builder.createUnaryOp(spv::OpCopyLogical, boolArrayTypeId, loadedId);

            glslang::TType glslangElementType(type, 0);
            spv::Id elementNominalTypeId = builder.getContainedTypeId(nominalTypeId);
            std::vector<spv::Id> constituents;
            for (int index = 0; index < type.getOuterArraySize(); ++index) {
                // get the element
                spv::Id elementValue = builder.createCompositeExtract(loadedId, elementNominalTypeId, index);

                // recursively convert it
                spv::Id elementConvertedValue = convertLoadedBoolInUniformToUint(glslangElementType, elementNominalTypeId, elementValue);
                constituents.push_back(elementConvertedValue);
            }
            return builder.createCompositeConstruct(boolArrayTypeId, constituents);
        }
    }

    return loadedId;
}